

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)600>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  undefined8 interface_00;
  bool bVar1;
  int32 modelVersion;
  CategoryTypeCase CVar2;
  CoreML *pCVar3;
  OneHotEncoder *pOVar4;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_159;
  string local_158;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_135;
  TypeCase local_134;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  byte local_da;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d9;
  TypeCase local_d8;
  bool sparse;
  undefined4 uStack_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    pCVar3 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_d8 = kInt64Type;
    uStack_d4 = 3;
    local_d0 = &local_d8;
    local_c8 = 2;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d9);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_d9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_a8,pCVar3,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c0,in_R8);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d9);
    bVar1 = Result::good((Result *)local_48);
    if (bVar1) {
      pOVar4 = Specification::Model::onehotencoder(format);
      local_da = Specification::OneHotEncoder::outputsparse(pOVar4);
      pCVar3 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      local_134 = (local_da & 1) + kMultiArrayType;
      local_130 = &local_134;
      local_128 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_135);
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_120,__l,&local_135);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_108,pCVar3,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_120,
                 in_R8);
      Result::operator=((Result *)local_48,&local_108);
      Result::~Result(&local_108);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_120);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_135);
      bVar1 = Result::good((Result *)local_48);
      if (bVar1) {
        pOVar4 = Specification::Model::onehotencoder(format);
        CVar2 = Specification::OneHotEncoder::CategoryType_case(pOVar4);
        if (CVar2 == CATEGORYTYPE_NOT_SET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_158,"OneHotEncoder parameter incorrect type",&local_159);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  local_80 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_oneHotEncoder>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1,
                                                             { Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kStringType });
        if (!result.good()) {
            return result;
        }
        
        // If sparse then the input must be dictionary
        bool sparse = format.onehotencoder().outputsparse();

        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {(sparse ? Specification::FeatureType::kDictionaryType : Specification::FeatureType::kMultiArrayType)});
        // Validate the outputs
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        switch (format.onehotencoder().CategoryType_case()) {
            case Specification::OneHotEncoder::kInt64Categories:
                break;
            case Specification::OneHotEncoder::kStringCategories:
                break;
            case Specification::OneHotEncoder::CATEGORYTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "OneHotEncoder parameter incorrect type");
        }

        return result;
    }